

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_test.cc
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* readFrames_abi_cxx11_
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,char *file)

{
  char cVar1;
  size_t sVar2;
  istream *piVar3;
  long local_250;
  ifstream in;
  byte abStack_230 [488];
  undefined1 local_48 [8];
  string line;
  
  std::ifstream::ifstream((istream *)&local_250,file,_S_in);
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((abStack_230[*(long *)(local_250 + -0x18)] & 5) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Could not open \'",0x10);
    if (file == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x4c51b0);
    }
    else {
      sVar2 = strlen(file);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,file,sVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'",1);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x50);
    std::ostream::put(-0x50);
    std::ostream::flush();
  }
  line._M_dataplus._M_p = (pointer)0x0;
  line._M_string_length._0_1_ = 0;
  local_48 = (undefined1  [8])&line._M_string_length;
  while( true ) {
    cVar1 = std::ios::widen((char)*(undefined8 *)(local_250 + -0x18) + (char)(istream *)&local_250);
    piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&local_250,(string *)local_48,cVar1);
    if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               __return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
  }
  if (local_48 != (undefined1  [8])&line._M_string_length) {
    operator_delete((void *)local_48,
                    CONCAT71(line._M_string_length._1_7_,(undefined1)line._M_string_length) + 1);
  }
  std::ifstream::~ifstream(&local_250);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> readFrames(const char* file)
{
    std::ifstream in(file);
    std::vector<std::string> result;

    if (!in)
    {
        std::cerr << "Could not open '" << file << "'" << std::endl;
    }
    std::string line;

    while (std::getline(in, line))
    {
        result.push_back(std::move(line));
    }

    return result;
}